

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

string * __thiscall
flatbuffers::FlatBufMethod::name_abi_cxx11_(string *__return_storage_ptr__,FlatBufMethod *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->method_);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return method_->name; }